

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::paintEvent(QTableView *this,QPaintEvent *event)

{
  bool bVar1;
  bool bVar2;
  QTableViewPrivate *this_00;
  QPoint QVar3;
  QHeaderView *this_01;
  QHeaderView *this_02;
  QWidget *pQVar4;
  Data *pDVar5;
  QWidgetData *pQVar6;
  QAbstractItemModel *pQVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  LayoutDirection LVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Representation RVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int logicalIndex;
  int iVar26;
  int iVar27;
  LayoutDirection LVar28;
  int iVar29;
  QStyle *pQVar30;
  int *piVar31;
  int *piVar32;
  QPen *pQVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  char *pcVar38;
  int visualIndex;
  uint visualIndex_00;
  QPaintDevice *pQVar39;
  byte bVar40;
  int firstVisualColumn;
  uint visualIndex_01;
  uint uVar41;
  long in_FS_OFFSET;
  undefined1 auVar42 [16];
  R_conflict2 RVar43;
  Representation local_208;
  QModelIndex local_188;
  undefined1 *local_170;
  QPen old;
  QRegion region;
  QBitArray local_148;
  QPainter painter;
  QPen gridPen;
  qreal local_118;
  undefined4 local_110;
  undefined4 local_10c;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(this,&local_108);
  QVar3 = (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset;
  bVar1 = this_00->showGrid;
  uVar9 = (uint)bVar1;
  pQVar30 = QWidget::style((QWidget *)this);
  uVar10 = (**(code **)(*(long *)pQVar30 + 0xf0))(pQVar30,0x22,&local_108,this,0);
  local_10c = 0xaaaaaaaa;
  auVar42 = QColor::fromRgba(uVar10);
  local_118 = auVar42._0_8_;
  local_110 = auVar42._8_4_;
  local_10c._0_2_ = auVar42._12_2_;
  _gridPen = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_188,(QColor *)&local_118,SolidPattern);
  QPen::QPen(&gridPen,(QBrush *)&local_188,1.0,this_00->gridStyle,SquareCap,BevelJoin);
  QBrush::~QBrush((QBrush *)&local_188);
  this_01 = this_00->verticalHeader;
  this_02 = this_00->horizontalHeader;
  bVar2 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
  LVar11 = QWidget::layoutDirection((QWidget *)this);
  _painter = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  pQVar39 = &pQVar4->super_QPaintDevice;
  if (pQVar4 == (QWidget *)0x0) {
    pQVar39 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter(&painter,pQVar39);
  iVar12 = QHeaderView::count(this_02);
  if ((((iVar12 != 0) && (iVar12 = QHeaderView::count(this_01), iVar12 != 0)) &&
      (pDVar5 = (this_00->super_QAbstractItemViewPrivate).itemDelegate.wp.d, pDVar5 != (Data *)0x0))
     && ((*(int *)(pDVar5 + 4) != 0 &&
         ((this_00->super_QAbstractItemViewPrivate).itemDelegate.wp.value != (QObject *)0x0)))) {
    iVar13 = QHeaderView::length(this_02);
    iVar14 = QHeaderView::offset(this_02);
    iVar15 = QHeaderView::length(this_01);
    uVar10 = QHeaderView::offset(this_01);
    iVar12 = QHeaderView::visualIndexAt(this_01,0);
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    pQVar6 = (this_01->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
             .data;
    iVar16 = QHeaderView::visualIndexAt
                       (this_01,((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1);
    if (iVar16 == -1) {
      pQVar7 = (this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_188,&(this_00->super_QAbstractItemViewPrivate).root);
      iVar16 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7);
      iVar16 = iVar16 + -1;
    }
    iVar17 = QHeaderView::visualIndexAt(this_02,0);
    pQVar6 = (this_02->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
             .data;
    iVar18 = QHeaderView::visualIndexAt
                       (this_02,((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1);
    firstVisualColumn = iVar17;
    if (LVar11 == RightToLeft) {
      firstVisualColumn = iVar18;
      iVar18 = iVar17;
    }
    if (firstVisualColumn == -1) {
      firstVisualColumn = 0;
    }
    if (iVar18 == -1) {
      iVar18 = QHeaderView::count(this_02);
      iVar18 = iVar18 + -1;
    }
    iVar17 = (iVar18 - firstVisualColumn) + 1;
    local_148.d.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QBitArray::QBitArray(&local_148,(long)(((iVar16 - iVar12) + 1) * iVar17),false);
    region.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::translated((int)&region,(int)event + 0x20);
    if ((QSpanCollection *)
        (this_00->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_00->spans) {
      QTableViewPrivate::drawAndClipSpans
                (this_00,&region,&painter,&local_108,&local_148,iVar12,iVar16,firstVisualColumn,
                 iVar18);
    }
    piVar31 = (int *)QRegion::begin();
    piVar32 = (int *)QRegion::end();
    if (piVar31 != piVar32) {
      iVar13 = (iVar13 - iVar14) - (uint)(LVar11 != RightToLeft);
      local_208 = QVar3.xp.m_i;
      RVar19 = QVar3.yp.m_i;
      bVar40 = ((char)iVar18 - (char)firstVisualColumn) + 1;
      do {
        iVar14 = piVar31[3];
        if ((int)(iVar15 + ~uVar10) <= piVar31[3]) {
          iVar14 = iVar15 + ~uVar10;
        }
        iVar16 = *piVar31;
        iVar18 = piVar31[2];
        if (LVar11 == RightToLeft) {
          pQVar6 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          iVar34 = ((pQVar6->crect).x2.m_i - ((pQVar6->crect).x1.m_i + iVar13)) + 1;
          if (iVar16 <= iVar34) {
            iVar16 = iVar34;
          }
        }
        else if (iVar13 <= iVar18) {
          iVar18 = iVar13;
        }
        if ((iVar16 <= iVar18) && (iVar34 = piVar31[1], iVar34 <= iVar14)) {
          iVar20 = QHeaderView::visualIndexAt(this_02,iVar16);
          iVar21 = QHeaderView::visualIndexAt(this_02,iVar18);
          iVar29 = iVar20;
          if (LVar11 == RightToLeft) {
            iVar29 = iVar21;
            iVar21 = iVar20;
          }
          if (iVar29 == -1) {
            iVar29 = 0;
          }
          if (iVar21 == -1) {
            iVar21 = QHeaderView::count(this_02);
            iVar21 = iVar21 + -1;
          }
          uVar22 = QHeaderView::visualIndexAt(this_01,iVar14);
          if (uVar22 == 0xffffffff) {
            iVar20 = QHeaderView::count(this_01);
            uVar22 = iVar20 - 1;
          }
          if ((bVar2 == false) || (bVar8 = QHeaderView::sectionsHidden(this_01), !bVar8)) {
            visualIndex_01 = QHeaderView::visualIndexAt(this_01,iVar34);
            uVar36 = visualIndex_01 & 1;
            if ((visualIndex_01 & 1) != 0) {
              uVar36 = (uint)bVar2;
            }
          }
          else {
            iVar20 = QHeaderView::offset(this_01);
            QHeaderView::logicalIndex(this_01,0);
            iVar23 = QHeaderView::sectionSize(this_01,0);
            uVar36 = 0;
            if (iVar20 < iVar23) {
              visualIndex_01 = 0;
            }
            else {
              visualIndex_01 = 0;
              if (0 < (int)uVar22) {
                visualIndex_01 = 0;
                uVar36 = 0;
                do {
                  iVar24 = QHeaderView::logicalIndex(this_01,visualIndex_01);
                  bVar8 = QHeaderView::isSectionHidden(this_01,iVar24);
                  uVar36 = (byte)((byte)uVar36 ^ bVar8) ^ 1;
                  visualIndex_01 = visualIndex_01 + 1;
                  iVar24 = QHeaderView::sectionSize(this_01,visualIndex_01);
                  iVar23 = iVar24 + iVar23;
                  if (iVar20 < iVar23) break;
                } while ((int)visualIndex_01 < (int)uVar22);
              }
            }
          }
          if ((visualIndex_01 != 0xffffffff) && ((int)visualIndex_01 <= (int)uVar22)) {
            iVar20 = (visualIndex_01 - iVar12) * iVar17 - firstVisualColumn;
            uVar41 = (uint)(byte)(bVar40 * ((char)visualIndex_01 - (char)iVar12) -
                                 (char)firstVisualColumn);
            visualIndex_00 = visualIndex_01;
            do {
              iVar23 = QHeaderView::logicalIndex(this_01,visualIndex_00);
              bVar8 = QHeaderView::isSectionHidden(this_01,iVar23);
              if (!bVar8) {
                iVar24 = QHeaderView::sectionViewportPosition
                                   (*(QHeaderView **)
                                     (*(long *)&(this->super_QAbstractItemView).
                                                super_QAbstractScrollArea.super_QFrame.super_QWidget
                                                .field_0x8 + 0x588),iVar23);
                iVar25 = QHeaderView::sectionSize
                                   (*(QHeaderView **)
                                     (*(long *)&(this->super_QAbstractItemView).
                                                super_QAbstractScrollArea.super_QFrame.super_QWidget
                                                .field_0x8 + 0x588),iVar23);
                if (iVar29 <= iVar21) {
                  visualIndex = iVar29;
                  do {
                    uVar35 = iVar20 + visualIndex;
                    if (-1 < (int)uVar35) {
                      pcVar38 = local_148.d.d.ptr;
                      if (local_148.d.d.ptr == (char *)0x0) {
                        pcVar38 = (char *)&QByteArray::_empty;
                      }
                      if (((long)(ulong)uVar35 < local_148.d.d.size * 8 - (long)*pcVar38) &&
                         (uVar37 = uVar41 + visualIndex & 7,
                         ((byte)local_148.d.d.ptr[(ulong)(uVar35 >> 3) + 1] >> uVar37 & 1) == 0)) {
                        RVar43 = QBitArray::bitLocation<QBitArray>
                                           (&local_148,(QBitArray *)(ulong)uVar35,(ulong)uVar37);
                        *RVar43.byte = *RVar43.byte | RVar43.bitMask;
                        logicalIndex = QHeaderView::logicalIndex(this_02,visualIndex);
                        bVar8 = QHeaderView::isSectionHidden(this_02,logicalIndex);
                        if (!bVar8) {
                          iVar26 = QHeaderView::sectionViewportPosition
                                             (*(QHeaderView **)
                                               (*(long *)&(this->super_QAbstractItemView).
                                                          super_QAbstractScrollArea.super_QFrame.
                                                          super_QWidget.field_0x8 + 0x580),
                                              logicalIndex);
                          iVar27 = QHeaderView::sectionSize
                                             (*(QHeaderView **)
                                               (*(long *)&(this->super_QAbstractItemView).
                                                          super_QAbstractScrollArea.super_QFrame.
                                                          super_QWidget.field_0x8 + 0x580),
                                              logicalIndex);
                          local_188.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                          local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                          local_188.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
                          pQVar7 = (this_00->super_QAbstractItemViewPrivate).model;
                          QPersistentModelIndex::operator_cast_to_QModelIndex
                                    ((QModelIndex *)&old,
                                     &(this_00->super_QAbstractItemViewPrivate).root);
                          (**(code **)(*(long *)pQVar7 + 0x60))
                                    (&local_188,pQVar7,iVar23,logicalIndex,&old);
                          if (((-1 < local_188.r) && (-1 < (long)local_188._0_8_)) &&
                             (local_188.m.ptr != (QAbstractItemModel *)0x0)) {
                            local_108.super_QStyleOption.rect.x1.m_i =
                                 iVar26 + (uint)(byte)(bVar1 & LVar11 == RightToLeft) +
                                          local_208.m_i;
                            local_108.super_QStyleOption.rect.x2.m_i =
                                 iVar27 + ~uVar9 + local_108.super_QStyleOption.rect.x1.m_i;
                            if (bVar2 != false) {
                              local_108.features.
                              super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                              super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
                                   (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
                                   ((uint)local_108.features.
                                          super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>
                                          .
                                          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>
                                          .i & 0xfffffffd | (uVar36 & 1) * 2);
                            }
                            local_108.super_QStyleOption.rect.y1.m_i = iVar24 + RVar19.m_i;
                            local_108.super_QStyleOption.rect.y2.m_i =
                                 iVar25 + ~uVar9 + iVar24 + RVar19.m_i;
                            QTableViewPrivate::drawCell(this_00,&painter,&local_108,&local_188);
                          }
                        }
                      }
                    }
                    visualIndex = visualIndex + 1;
                  } while (iVar21 + 1 != visualIndex);
                }
                uVar35 = uVar36 & 1;
                uVar36 = (uint)bVar2;
                if (uVar35 != 0) {
                  uVar36 = 0;
                }
              }
              iVar20 = iVar20 + iVar17;
              uVar41 = uVar41 + bVar40;
              bVar8 = visualIndex_00 != uVar22;
              visualIndex_00 = visualIndex_00 + 1;
            } while (bVar8);
            if (uVar9 != 0) {
              do {
                uVar36 = uVar22;
                iVar20 = QHeaderView::logicalIndex(this_01,uVar36);
                bVar8 = QHeaderView::isSectionHidden(this_01,iVar20);
                uVar22 = uVar36 - 1;
              } while (bVar8);
              _old = &DAT_aaaaaaaaaaaaaaaa;
              pQVar33 = (QPen *)QPainter::pen();
              QPen::QPen(&old,pQVar33);
              QPainter::setPen((QPen *)&painter);
              if ((int)visualIndex_01 <= (int)uVar36) {
                uVar22 = visualIndex_01;
                do {
                  iVar20 = QHeaderView::logicalIndex(this_01,uVar22);
                  bVar8 = QHeaderView::isSectionHidden(this_01,iVar20);
                  if (!bVar8) {
                    iVar23 = QHeaderView::sectionViewportPosition
                                       (*(QHeaderView **)
                                         (*(long *)&(this->super_QAbstractItemView).
                                                    super_QAbstractScrollArea.super_QFrame.
                                                    super_QWidget.field_0x8 + 0x588),iVar20);
                    iVar20 = QHeaderView::sectionSize
                                       (*(QHeaderView **)
                                         (*(long *)&(this->super_QAbstractItemView).
                                                    super_QAbstractScrollArea.super_QFrame.
                                                    super_QWidget.field_0x8 + 0x588),iVar20);
                    local_188.i = (quintptr)
                                  ((double)(int)(iVar23 + (RVar19.m_i - uVar9) + iVar20) + 0.5);
                    local_188._0_8_ = (QAbstractItemModel *)((double)iVar16 + 0.5);
                    local_188.m.ptr = (QAbstractItemModel *)((double)iVar18 + 0.5);
                    local_170 = (undefined1 *)local_188.i;
                    QPainter::drawLines((QLineF *)&painter,(int)&local_188);
                  }
                  bVar8 = (int)uVar22 < (int)uVar36;
                  uVar22 = uVar22 + 1;
                } while (bVar8);
              }
              if (iVar29 <= iVar21) {
                iVar20 = iVar29;
                do {
                  iVar23 = QHeaderView::logicalIndex(this_02,iVar20);
                  bVar8 = QHeaderView::isSectionHidden(this_02,iVar23);
                  if (!bVar8) {
                    iVar24 = QHeaderView::sectionViewportPosition
                                       (*(QHeaderView **)
                                         (*(long *)&(this->super_QAbstractItemView).
                                                    super_QAbstractScrollArea.super_QFrame.
                                                    super_QWidget.field_0x8 + 0x580),iVar23);
                    iVar24 = iVar24 + local_208.m_i;
                    if (LVar11 != RightToLeft) {
                      iVar23 = QHeaderView::sectionSize
                                         (*(QHeaderView **)
                                           (*(long *)&(this->super_QAbstractItemView).
                                                      super_QAbstractScrollArea.super_QFrame.
                                                      super_QWidget.field_0x8 + 0x580),iVar23);
                      iVar24 = (iVar24 - uVar9) + iVar23;
                    }
                    local_188._0_8_ = (double)iVar24 + 0.5;
                    local_188.i = (quintptr)((double)iVar34 + 0.5);
                    local_188.m.ptr = (QAbstractItemModel *)local_188._0_8_;
                    local_170 = (undefined1 *)((double)iVar14 + 0.5);
                    QPainter::drawLines((QLineF *)&painter,(int)&local_188);
                  }
                  iVar20 = iVar20 + 1;
                } while (iVar21 + 1 != iVar20);
              }
              pQVar30 = QWidget::style((QWidget *)this);
              iVar21 = (**(code **)(*(long *)pQVar30 + 0xf0))(pQVar30,0x76,&local_108,this,0);
              if (iVar21 != 0) {
                if ((((this_02->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.data)->widget_attributes & 0x10000) != 0) {
                  iVar21 = QHeaderView::logicalIndex(this_01,visualIndex_01);
                  bVar8 = QHeaderView::isSectionHidden(this_01,iVar21);
                  if ((!bVar8) &&
                     (iVar21 = QHeaderView::sectionViewportPosition
                                         (*(QHeaderView **)
                                           (*(long *)&(this->super_QAbstractItemView).
                                                      super_QAbstractScrollArea.super_QFrame.
                                                      super_QWidget.field_0x8 + 0x588),iVar21),
                     iVar21 + RVar19.m_i == iVar34)) {
                    local_188.c = iVar34;
                    local_188.r = iVar16;
                    local_188.i = CONCAT44(iVar34,iVar18);
                    QPainter::drawLines((QLine *)&painter,(int)&local_188);
                  }
                }
                if ((((this_01->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.data)->widget_attributes & 0x10000) != 0) {
                  iVar21 = QHeaderView::logicalIndex(this_02,iVar29);
                  bVar8 = QHeaderView::isSectionHidden(this_02,iVar21);
                  if (!bVar8) {
                    iVar21 = QHeaderView::sectionViewportPosition
                                       (*(QHeaderView **)
                                         (*(long *)&(this->super_QAbstractItemView).
                                                    super_QAbstractScrollArea.super_QFrame.
                                                    super_QWidget.field_0x8 + 0x580),iVar21);
                    iVar21 = iVar21 + local_208.m_i;
                    LVar28 = QWidget::layoutDirection((QWidget *)this);
                    if (LVar28 != LeftToRight) {
                      iVar29 = QHeaderView::sectionSize
                                         (*(QHeaderView **)
                                           (*(long *)&(this->super_QAbstractItemView).
                                                      super_QAbstractScrollArea.super_QFrame.
                                                      super_QWidget.field_0x8 + 0x580),iVar29);
                      iVar21 = iVar21 + iVar29 + -1;
                    }
                    LVar28 = QWidget::layoutDirection((QWidget *)this);
                    if ((LVar28 == LeftToRight) && (iVar21 == iVar16)) {
                      local_188.c = iVar34;
                      local_188.r = iVar16;
                      local_188.i = CONCAT44(iVar14,iVar16);
                      QPainter::drawLines((QLine *)&painter,(int)&local_188);
                    }
                    LVar28 = QWidget::layoutDirection((QWidget *)this);
                    if ((LVar28 != LeftToRight) && (iVar21 == iVar18)) {
                      local_188.c = iVar34;
                      local_188.r = iVar18;
                      local_188.i = CONCAT44(iVar14,iVar18);
                      QPainter::drawLines((QLine *)&painter,(int)&local_188);
                    }
                  }
                }
              }
              QPainter::setPen((QPen *)&painter);
              QPen::~QPen(&old);
            }
          }
        }
        piVar31 = piVar31 + 4;
      } while (piVar31 != piVar32);
    }
    QAbstractItemViewPrivate::paintDropIndicator(&this_00->super_QAbstractItemViewPrivate,&painter);
    QRegion::~QRegion(&region);
    if (&(local_148.d.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QPainter::~QPainter(&painter);
  QPen::~QPen(&gridPen);
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::paintEvent(QPaintEvent *event)
{
    Q_D(QTableView);
    // setup temp variables for the painting
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QPoint offset = d->scrollDelayOffset;
    const bool showGrid = d->showGrid;
    const int gridSize = showGrid ? 1 : 0;
    const int gridHint = style()->styleHint(QStyle::SH_Table_GridLineColor, &option, this);
    const QColor gridColor = QColor::fromRgba(static_cast<QRgb>(gridHint));
    const QPen gridPen = QPen(gridColor, 1, d->gridStyle);
    const QHeaderView *verticalHeader = d->verticalHeader;
    const QHeaderView *horizontalHeader = d->horizontalHeader;
    const bool alternate = d->alternatingColors;
    const bool rightToLeft = isRightToLeft();

    QPainter painter(d->viewport);

    // if there's nothing to do, clear the area and return
    if (horizontalHeader->count() == 0 || verticalHeader->count() == 0 || !d->itemDelegate)
        return;

    const int x = horizontalHeader->length() - horizontalHeader->offset() - (rightToLeft ? 0 : 1);
    const int y = verticalHeader->length() - verticalHeader->offset() - 1;

    //firstVisualRow is the visual index of the first visible row.  lastVisualRow is the visual index of the last visible Row.
    //same goes for ...VisualColumn
    int firstVisualRow = qMax(verticalHeader->visualIndexAt(0),0);
    int lastVisualRow = verticalHeader->visualIndexAt(verticalHeader->height());
    if (lastVisualRow == -1)
        lastVisualRow = d->model->rowCount(d->root) - 1;

    int firstVisualColumn = horizontalHeader->visualIndexAt(0);
    int lastVisualColumn = horizontalHeader->visualIndexAt(horizontalHeader->width());
    if (rightToLeft)
        qSwap(firstVisualColumn, lastVisualColumn);
    if (firstVisualColumn == -1)
        firstVisualColumn = 0;
    if (lastVisualColumn == -1)
        lastVisualColumn = horizontalHeader->count() - 1;

    QBitArray drawn((lastVisualRow - firstVisualRow + 1) * (lastVisualColumn - firstVisualColumn + 1));

    const QRegion region = event->region().translated(offset);

    if (d->hasSpans()) {
        d->drawAndClipSpans(region, &painter, option, &drawn,
                             firstVisualRow, lastVisualRow, firstVisualColumn, lastVisualColumn);
    }

    for (QRect dirtyArea : region) {
        dirtyArea.setBottom(qMin(dirtyArea.bottom(), int(y)));
        if (rightToLeft) {
            dirtyArea.setLeft(qMax(dirtyArea.left(), d->viewport->width() - int(x)));
        } else {
            dirtyArea.setRight(qMin(dirtyArea.right(), int(x)));
        }
        // dirtyArea may be invalid when the horizontal header is not stretched
        if (!dirtyArea.isValid())
            continue;

        // get the horizontal start and end visual sections
        int left = horizontalHeader->visualIndexAt(dirtyArea.left());
        int right = horizontalHeader->visualIndexAt(dirtyArea.right());
        if (rightToLeft)
            qSwap(left, right);
        if (left == -1) left = 0;
        if (right == -1) right = horizontalHeader->count() - 1;

        // get the vertical start and end visual sections and if alternate color
        int bottom = verticalHeader->visualIndexAt(dirtyArea.bottom());
        if (bottom == -1) bottom = verticalHeader->count() - 1;
        int top = 0;
        bool alternateBase = false;
        if (alternate && verticalHeader->sectionsHidden()) {
            const int verticalOffset = verticalHeader->offset();
            int row = verticalHeader->logicalIndex(top);
            for (int y = 0;
                 ((y += verticalHeader->sectionSize(top)) <= verticalOffset) && (top < bottom);
                 ++top) {
                row = verticalHeader->logicalIndex(top);
                if (alternate && !verticalHeader->isSectionHidden(row))
                    alternateBase = !alternateBase;
            }
        } else {
            top = verticalHeader->visualIndexAt(dirtyArea.top());
            alternateBase = (top & 1) && alternate;
        }
        if (top == -1 || top > bottom)
            continue;

        // Paint each row item
        for (int visualRowIndex = top; visualRowIndex <= bottom; ++visualRowIndex) {
            int row = verticalHeader->logicalIndex(visualRowIndex);
            if (verticalHeader->isSectionHidden(row))
                continue;
            int rowY = rowViewportPosition(row);
            rowY += offset.y();
            int rowh = rowHeight(row) - gridSize;

            // Paint each column item
            for (int visualColumnIndex = left; visualColumnIndex <= right; ++visualColumnIndex) {
                int currentBit = (visualRowIndex - firstVisualRow) * (lastVisualColumn - firstVisualColumn + 1)
                        + visualColumnIndex - firstVisualColumn;

                if (currentBit < 0 || currentBit >= drawn.size() || drawn.testBit(currentBit))
                    continue;
                drawn.setBit(currentBit);

                int col = horizontalHeader->logicalIndex(visualColumnIndex);
                if (horizontalHeader->isSectionHidden(col))
                    continue;
                int colp = columnViewportPosition(col);
                colp += offset.x();
                int colw = columnWidth(col) - gridSize;

                const QModelIndex index = d->model->index(row, col, d->root);
                if (index.isValid()) {
                    option.rect = QRect(colp + (showGrid && rightToLeft ? 1 : 0), rowY, colw, rowh);
                    if (alternate) {
                        if (alternateBase)
                            option.features |= QStyleOptionViewItem::Alternate;
                        else
                            option.features &= ~QStyleOptionViewItem::Alternate;
                    }
                    d->drawCell(&painter, option, index);
                }
            }
            alternateBase = !alternateBase && alternate;
        }

        if (showGrid) {
            // Find the bottom right (the last rows/columns might be hidden)
            while (verticalHeader->isSectionHidden(verticalHeader->logicalIndex(bottom))) --bottom;
            QPen old = painter.pen();
            painter.setPen(gridPen);
            // Paint each row
            for (int visualIndex = top; visualIndex <= bottom; ++visualIndex) {
                int row = verticalHeader->logicalIndex(visualIndex);
                if (verticalHeader->isSectionHidden(row))
                    continue;
                int rowY = rowViewportPosition(row);
                rowY += offset.y();
                int rowh = rowHeight(row) - gridSize;
                QLineF line(dirtyArea.left(), rowY + rowh, dirtyArea.right(), rowY + rowh);
                painter.drawLine(line.translated(0.5, 0.5));
            }

            // Paint each column
            for (int h = left; h <= right; ++h) {
                int col = horizontalHeader->logicalIndex(h);
                if (horizontalHeader->isSectionHidden(col))
                    continue;
                int colp = columnViewportPosition(col);
                colp += offset.x();
                if (!rightToLeft)
                    colp +=  columnWidth(col) - gridSize;
                QLineF line(colp, dirtyArea.top(), colp, dirtyArea.bottom());
                painter.drawLine(line.translated(0.5, 0.5));
            }
            const bool drawWhenHidden = style()->styleHint(QStyle::SH_Table_AlwaysDrawLeftTopGridLines,
                                                           &option, this);
            if (drawWhenHidden && horizontalHeader->isHidden()) {
                const int row = verticalHeader->logicalIndex(top);
                if (!verticalHeader->isSectionHidden(row)) {
                    const int rowY = rowViewportPosition(row) + offset.y();
                    if (rowY == dirtyArea.top())
                        painter.drawLine(dirtyArea.left(), rowY, dirtyArea.right(), rowY);
                }
            }
            if (drawWhenHidden && verticalHeader->isHidden()) {
                const int col = horizontalHeader->logicalIndex(left);
                if (!horizontalHeader->isSectionHidden(col)) {
                    int colX = columnViewportPosition(col) + offset.x();
                    if (!isLeftToRight())
                        colX += columnWidth(left) - 1;
                    if (isLeftToRight() && colX == dirtyArea.left())
                        painter.drawLine(colX, dirtyArea.top(), colX, dirtyArea.bottom());
                    if (!isLeftToRight() && colX == dirtyArea.right())
                        painter.drawLine(colX, dirtyArea.top(), colX, dirtyArea.bottom());
                }
            }
            painter.setPen(old);
        }
    }

#if QT_CONFIG(draganddrop)
    // Paint the dropIndicator
    d->paintDropIndicator(&painter);
#endif
}